

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::closeHandle(CommonCore *this,InterfaceHandle handle)

{
  byte *pbVar1;
  shared_mutex *__rwlock;
  int iVar2;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var3;
  BasicHandleInfo *pBVar4;
  InvalidIdentifier *this_00;
  string_view message;
  ActionMessage cmd;
  undefined1 auStack_d8 [184];
  
  p_Var3 = getHandleInfo(this,handle);
  if (p_Var3 == (_Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                 *)0x0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    message._M_str = "invalid handle";
    message._M_len = 0xe;
    InvalidIdentifier::InvalidIdentifier(this_00,message);
    __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
  }
  if (((p_Var3->
       super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
       ).
       super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
       ._M_storage._M_storage.__data[7] & 0x10) == 0) {
    ActionMessage::ActionMessage((ActionMessage *)auStack_d8,cmd_close_interface);
    auStack_d8._8_8_ = (p_Var3->super__Hash_node_base)._M_nxt;
    auStack_d8._4_4_ =
         SEXT14((char)(p_Var3->
                      super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                      ._M_storage._M_storage.__data[4]);
    BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)auStack_d8);
    __rwlock = &(this->handles).m_mutex;
    iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
    if (iVar2 == 0x23) {
      std::__throw_system_error(0x23);
    }
    pBVar4 = HandleManager::getHandleInfo(&(this->handles).m_obj,handle);
    pbVar1 = (byte *)((long)&pBVar4->flags + 1);
    *pbVar1 = *pbVar1 | 0x10;
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    ActionMessage::~ActionMessage((ActionMessage *)auStack_d8);
  }
  return;
}

Assistant:

void CommonCore::closeHandle(InterfaceHandle handle)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (checkActionFlag(*handleInfo, disconnected_flag)) {
        return;
    }
    ActionMessage cmd(CMD_CLOSE_INTERFACE);
    cmd.setSource(handleInfo->handle);
    cmd.messageID = static_cast<int32_t>(handleInfo->handleType);
    addActionMessage(cmd);
    handles.modify(
        [handle](auto& hand) { setActionFlag(*hand.getHandleInfo(handle), disconnected_flag); });
}